

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_rsa_sha2_256_signed.c
# Opt level: O2

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  
  iVar1 = test_auth_pubkey(session,0,"libssh2",(char *)0x0,"key_rsa_sha2_256_signed-cert.pub",
                           "key_rsa_sha2_256_signed");
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_RSA_SHA2 && \
    (defined(LIBSSH2_OPENSSL) || defined(LIBSSH2_WOLFSSL))
    /* set in Dockerfile */
    return test_auth_pubkey(session, 0,
                            "libssh2",
                            NULL,
                            "key_rsa_sha2_256_signed-cert.pub",
                            "key_rsa_sha2_256_signed");
#else
    (void)session;
    return 0;
#endif
}